

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O2

int __thiscall
MEM_CPY<Fad<double>_>::copy(MEM_CPY<Fad<double>_> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  Fad<double> *this_00;
  Fad<double> *pFVar5;
  bool bVar6;
  Fad<double> tmp1;
  Fad<double> tmp0;
  Fad<double> tmp3;
  Fad<double> tmp2;
  Fad<double> local_b0;
  Fad<double> local_90;
  Fad<double> local_70;
  Fad<double> local_50;
  
  uVar2 = (uint)src;
  uVar4 = (ulong)(uVar2 & 3);
  uVar3 = uVar4;
  this_00 = (Fad<double> *)this;
  pFVar5 = (Fad<double> *)dst;
  while (bVar6 = uVar3 != 0, uVar3 = uVar3 - 1, bVar6) {
    Fad<double>::operator=(this_00,pFVar5);
    this_00 = this_00 + 1;
    pFVar5 = pFVar5 + 1;
  }
  uVar3 = (ulong)((uVar2 & 3) << 5);
  lVar1 = (long)(int)uVar2;
  for (; (long)uVar4 < (long)(int)uVar2; uVar4 = uVar4 + 4) {
    Fad<double>::Fad(&local_90);
    Fad<double>::Fad(&local_b0);
    Fad<double>::Fad(&local_50);
    Fad<double>::Fad(&local_70);
    Fad<double>::operator=(&local_90,(Fad<double> *)(dst + uVar3));
    Fad<double>::operator=(&local_b0,(Fad<double> *)(dst + uVar3 + 0x20));
    Fad<double>::operator=(&local_50,(Fad<double> *)(dst + uVar3 + 0x40));
    Fad<double>::operator=(&local_70,(Fad<double> *)(dst + uVar3 + 0x60));
    Fad<double>::operator=((Fad<double> *)(this + uVar3),&local_90);
    Fad<double>::operator=((Fad<double> *)(this + uVar3 + 0x20),&local_b0);
    Fad<double>::operator=((Fad<double> *)(this + uVar3 + 0x40),&local_50);
    Fad<double>::operator=((Fad<double> *)(this + uVar3 + 0x60),&local_70);
    Fad<double>::~Fad(&local_70);
    Fad<double>::~Fad(&local_50);
    Fad<double>::~Fad(&local_b0);
    Fad<double>::~Fad(&local_90);
    lVar1 = 0x80;
    this = this + 0x80;
    dst = dst + 0x80;
  }
  return (int)lVar1;
}

Assistant:

static void copy(T* RESTRICT dest, const T* src, const int N)
    {
      // Unwind the inner loop, four elements at a time
      int Nmod4 = N & 0x03;

      int i=0;
      for (; i< Nmod4; ++i)
	dest[i] = src[i];

      for (; i<N; i+=4)
        {
	  // Common subexpression elimination: avoid doing i+1, i+2, i+3
	  // multiple times (compilers *won't* do this cse automatically) 
	  int i1 = i+1;
	  int i2 = i+2;
	  int i3 = i+3;

	  // Reading all the results first avoids aliasing
	  // ambiguities, and provides more flexibility in
	  // register allocation & instruction scheduling
	  T tmp0,tmp1, tmp2, tmp3;
	  tmp0 = src[i];
	  tmp1 = src[i1];
	  tmp2 = src[i2];
	  tmp3 = src[i3];

	  dest[i]  = tmp0;
	  dest[i1] = tmp1;
	  dest[i2] = tmp2;
	  dest[i3] = tmp3;
        }
    }